

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O1

int DTLSv1_get_timeout(SSL *ssl,timeval *out)

{
  DTLS1_STATE *pDVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  OPENSSL_timeval now;
  OPENSSL_timeval now_00;
  
  iVar2 = SSL_is_dtls(ssl);
  iVar5 = 0;
  if (iVar2 != 0) {
    now_00 = bssl::ssl_ctx_get_current_time
                       ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    pDVar1 = ssl->d1;
    uVar3 = bssl::DTLSTimer::MicrosecondsRemaining(&pDVar1->retransmit_timer,now_00);
    now._12_4_ = 0;
    now.tv_sec = SUB128(now_00._0_12_,0);
    now.tv_usec = SUB124(now_00._0_12_,8);
    uVar4 = bssl::DTLSTimer::MicrosecondsRemaining(&pDVar1->ack_timer,now);
    if (uVar4 < uVar3) {
      uVar3 = uVar4;
    }
    iVar5 = 0;
    if (uVar3 != 0xffffffffffffffff) {
      out->tv_sec = uVar3 / 1000000;
      out->tv_usec = uVar3 % 1000000;
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int DTLSv1_get_timeout(const SSL *ssl, struct timeval *out) {
  if (!SSL_is_dtls(ssl)) {
    return 0;
  }

  OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
  uint64_t remaining_usec =
      ssl->d1->retransmit_timer.MicrosecondsRemaining(now);
  remaining_usec =
      std::min(remaining_usec, ssl->d1->ack_timer.MicrosecondsRemaining(now));
  if (remaining_usec == DTLSTimer::kNever) {
    return 0;  // No timeout is set.
  }

  uint64_t remaining_sec = remaining_usec / 1000000;
  remaining_usec %= 1000000;

  // |timeval| uses |time_t|, which may be 32-bit.
  const auto kTvSecMax = std::numeric_limits<decltype(out->tv_sec)>::max();
  if (remaining_sec > static_cast<uint64_t>(kTvSecMax)) {
    out->tv_sec = kTvSecMax;  // Saturate the output.
    out->tv_usec = 999999;
  } else {
    out->tv_sec = static_cast<decltype(out->tv_sec)>(remaining_sec);
  }
  out->tv_usec = remaining_usec;
  return 1;
}